

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcPth.c
# Opt level: O0

void * Wla_Bmc3Thread(void *pArg)

{
  int iVar1;
  Saig_ParBmc_t *pBmcPars;
  Saig_ParBmc_t BmcPars;
  Abc_Ntk_t *pAbcNtk;
  Bmc3_ThData_t *pData;
  int nFramesNoChangeLim;
  int RetValue;
  int status;
  void *pArg_local;
  
  BmcPars.pFuncStop = (_func_int_int *)Abc_NtkFromAigPhase(*(Aig_Man_t **)((long)pArg + 8));
  Saig_ParBmcSetDefaultParams((Saig_ParBmc_t *)&pBmcPars);
  BmcPars._136_8_ = Wla_CallBackToStop;
  BmcPars.pFuncOnFail._0_4_ = *(undefined4 *)((long)pArg + 0x18);
  if (*(int *)(*(long *)(*pArg + 8) + 0x48) != 0) {
    pBmcPars._4_4_ = *(int *)(*pArg + 0x50) + 10;
  }
  iVar1 = Abc_NtkDarBmc3((Abc_Ntk_t *)BmcPars.pFuncStop,(Saig_ParBmc_t *)&pBmcPars,0);
  if (iVar1 == 0) {
    if (*(long *)(BmcPars.pFuncStop + 0x138) == 0) {
      __assert_fail("pAbcNtk->pSeqModel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcPth.c"
                    ,0x68,"void *Wla_Bmc3Thread(void *)");
    }
    **(undefined8 **)((long)pArg + 0x10) = *(undefined8 *)(BmcPars.pFuncStop + 0x138);
    *(undefined8 *)(BmcPars.pFuncStop + 0x138) = 0;
    if (*(int *)((long)pArg + 0x1c) != 0) {
      Abc_Print(1,"Bmc3 found CEX. RunId=%d.\n",(ulong)*(uint *)((long)pArg + 0x18));
    }
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&g_mutex);
    if (iVar1 != 0) {
      __assert_fail("status == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcPth.c"
                    ,0x6f,"void *Wla_Bmc3Thread(void *)");
    }
    g_nRunIds = g_nRunIds + 1;
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&g_mutex);
    if (iVar1 != 0) {
      __assert_fail("status == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcPth.c"
                    ,0x71,"void *Wla_Bmc3Thread(void *)");
    }
  }
  else if (iVar1 == -1) {
    if ((*(int *)((long)pArg + 0x18) < g_nRunIds) && (*(int *)((long)pArg + 0x1c) != 0)) {
      Abc_Print(1,"Bmc3 was cancelled. RunId=%d.\n",(ulong)*(uint *)((long)pArg + 0x18));
    }
    if ((1 < *(int *)(*pArg + 0x58)) && (*(int *)((long)pArg + 0x18) == g_nRunIds)) {
      iVar1 = Wla_ManShrinkAbs(*pArg,*(int *)(*pArg + 0x50) + 10,*(int *)((long)pArg + 0x18));
      *(int *)(*pArg + 0x50) = *(int *)(*pArg + 0x50) + 10;
      if (iVar1 == 1) {
        *(undefined4 *)(*pArg + 0x54) = 1;
        iVar1 = pthread_mutex_lock((pthread_mutex_t *)&g_mutex);
        if (iVar1 != 0) {
          __assert_fail("status == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcPth.c"
                        ,0x80,"void *Wla_Bmc3Thread(void *)");
        }
        g_nRunIds = g_nRunIds + 1;
        iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&g_mutex);
        if (iVar1 != 0) {
          __assert_fail("status == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcPth.c"
                        ,0x82,"void *Wla_Bmc3Thread(void *)");
        }
      }
    }
  }
  Abc_NtkDelete((Abc_Ntk_t *)BmcPars.pFuncStop);
  Aig_ManStop(*(Aig_Man_t **)((long)pArg + 8));
  if (pArg != (void *)0x0) {
    free(pArg);
  }
  pthread_exit((void *)0x0);
}

Assistant:

void * Wla_Bmc3Thread ( void * pArg )
{
    int status;
    int RetValue = -1;
    int nFramesNoChangeLim = 10;
    Bmc3_ThData_t * pData = (Bmc3_ThData_t *)pArg;
    Abc_Ntk_t * pAbcNtk = Abc_NtkFromAigPhase( pData->pAig );
    Saig_ParBmc_t BmcPars, *pBmcPars = &BmcPars;
    Saig_ParBmcSetDefaultParams( pBmcPars );
    pBmcPars->pFuncStop = Wla_CallBackToStop;
    pBmcPars->RunId = pData->RunId;

    if ( pData->pWla->pPars->fShrinkAbs )
        pBmcPars->nFramesMax = pData->pWla->iCexFrame + nFramesNoChangeLim;

    RetValue = Abc_NtkDarBmc3( pAbcNtk, pBmcPars, 0 );

    if ( RetValue == 0 )
    {
        assert( pAbcNtk->pSeqModel );
        *(pData->ppCex) = pAbcNtk->pSeqModel;
        pAbcNtk->pSeqModel = NULL;

        if ( pData->fVerbose )
            Abc_Print( 1, "Bmc3 found CEX. RunId=%d.\n", pData->RunId );

        status = pthread_mutex_lock(&g_mutex);  assert( status == 0 );
        ++g_nRunIds;
        status = pthread_mutex_unlock(&g_mutex);  assert( status == 0 );
    }
    else if ( RetValue == -1 )
    {
        if ( pData->RunId < g_nRunIds && pData->fVerbose )
            Abc_Print( 1, "Bmc3 was cancelled. RunId=%d.\n", pData->RunId );

        if ( pData->pWla->nIters > 1 && pData->RunId == g_nRunIds )
        {
            RetValue = Wla_ManShrinkAbs( pData->pWla, pData->pWla->iCexFrame + nFramesNoChangeLim, pData->RunId );
            pData->pWla->iCexFrame += nFramesNoChangeLim; 
            
            if ( RetValue == 1 )
            {
                pData->pWla->fNewAbs = 1;
                status = pthread_mutex_lock(&g_mutex);  assert( status == 0 );
                ++g_nRunIds;
                status = pthread_mutex_unlock(&g_mutex);  assert( status == 0 );
            }
        }
    }

    // free memory
    Abc_NtkDelete( pAbcNtk );
    Aig_ManStop( pData->pAig );
    ABC_FREE( pData );

    // quit this thread
    pthread_exit( NULL );
    assert(0);
    return NULL;
}